

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O1

void __thiscall myutils::SharedSemaphore::~SharedSemaphore(SharedSemaphore *this)

{
  sem_t *__sem;
  
  __sem = (sem_t *)this->m_sem;
  if (__sem == (sem_t *)0x0) {
    return;
  }
  if (__sem != (sem_t *)&this->m_unamed_sem) {
    sem_close(__sem);
    return;
  }
  sem_destroy(__sem);
  return;
}

Assistant:

SharedSemaphore::~SharedSemaphore()
{
#ifdef _WIN32
    if (m_hSemaphore) CloseHandle(m_hSemaphore);
#elif defined(__linux__)
    if (m_sem && m_sem != SEM_FAILED) {
        if (m_sem == &m_unamed_sem)
            sem_destroy(m_sem);
        else
            sem_close(m_sem);
    }
#endif
}